

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

void uv__signal_event(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uv_signal_t *handle_00;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  ulong uStack_250;
  int r;
  size_t i;
  size_t end;
  size_t bytes;
  char buf [512];
  uv_signal_t *handle;
  uv__signal_msg_t *msg;
  uint events_local;
  uv__io_t *w_local;
  uv_loop_t *loop_local;
  
  end = 0;
  i = 0;
  do {
    sVar2 = read(loop->signal_pipefd[0],buf + (end - 8),0x200 - end);
    iVar1 = (int)sVar2;
    if ((iVar1 != -1) || (piVar3 = __errno_location(), *piVar3 != 4)) {
      if ((iVar1 == -1) &&
         ((piVar3 = __errno_location(), *piVar3 == 0xb ||
          (piVar3 = __errno_location(), *piVar3 == 0xb)))) {
        if (end == 0) {
          return;
        }
      }
      else {
        if (iVar1 == -1) {
          abort();
        }
        i = (long)iVar1 + end & 0xfffffffffffffff0;
        for (uStack_250 = 0; uStack_250 < i; uStack_250 = uStack_250 + 0x10) {
          handle_00 = *(uv_signal_t **)(buf + (uStack_250 - 8));
          if (*(int *)(buf + uStack_250) == handle_00->signum) {
            if ((handle_00->flags & 1) != 0) {
              __assert_fail("!(handle->flags & UV_HANDLE_CLOSING)",
                            "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/signal.c"
                            ,499,"void uv__signal_event(uv_loop_t *, uv__io_t *, unsigned int)");
            }
            (*handle_00->signal_cb)(handle_00,handle_00->signum);
          }
          handle_00->dispatched_signals = handle_00->dispatched_signals + 1;
          if ((handle_00->flags & 0x2000000) != 0) {
            uv__signal_stop(handle_00);
          }
        }
        end = ((long)iVar1 + end) - i;
        if (end != 0) {
          memmove(&bytes,buf + (i - 8),end);
        }
      }
    }
  } while (i == 0x200);
  return;
}

Assistant:

static void uv__signal_event(uv_loop_t* loop,
                             uv__io_t* w,
                             unsigned int events) {
  uv__signal_msg_t* msg;
  uv_signal_t* handle;
  char buf[sizeof(uv__signal_msg_t) * 32];
  size_t bytes, end, i;
  int r;

  bytes = 0;
  end = 0;

  do {
    r = read(loop->signal_pipefd[0], buf + bytes, sizeof(buf) - bytes);

    if (r == -1 && errno == EINTR)
      continue;

    if (r == -1 && (errno == EAGAIN || errno == EWOULDBLOCK)) {
      /* If there are bytes in the buffer already (which really is extremely
       * unlikely if possible at all) we can't exit the function here. We'll
       * spin until more bytes are read instead.
       */
      if (bytes > 0)
        continue;

      /* Otherwise, there was nothing there. */
      return;
    }

    /* Other errors really should never happen. */
    if (r == -1)
      abort();

    bytes += r;

    /* `end` is rounded down to a multiple of sizeof(uv__signal_msg_t). */
    end = (bytes / sizeof(uv__signal_msg_t)) * sizeof(uv__signal_msg_t);

    for (i = 0; i < end; i += sizeof(uv__signal_msg_t)) {
      msg = (uv__signal_msg_t*) (buf + i);
      handle = msg->handle;

      if (msg->signum == handle->signum) {
        assert(!(handle->flags & UV_HANDLE_CLOSING));
        handle->signal_cb(handle, handle->signum);
      }

      handle->dispatched_signals++;

      if (handle->flags & UV_SIGNAL_ONE_SHOT)
        uv__signal_stop(handle);
    }

    bytes -= end;

    /* If there are any "partial" messages left, move them to the start of the
     * the buffer, and spin. This should not happen.
     */
    if (bytes) {
      memmove(buf, buf + end, bytes);
      continue;
    }
  } while (end == sizeof buf);
}